

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void __thiscall skiwi::anon_unknown_23::iftest::~iftest(iftest *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("2", run("(if (< 2 3) (2) (3))"));
      TEST_EQ("3", run("(if (< 3 2) (2) (3))"));
      TEST_EQ("12", run("(if #t 12 13)"));
      TEST_EQ("13", run("(if #f 12 13)"));
      TEST_EQ("12", run("(if 0 12 13)"));
      TEST_EQ("43", run("(if () 43 ())"));
      TEST_EQ("13", run("(if #t (if 12 13 4) 17)"));
      TEST_EQ("4", run("(if #f 12 (if #f 13 4))"));
      TEST_EQ("2", run(R"((if #\X (if 1 2 3) (if 4 5 6)))"));
      TEST_EQ("#t", run("(if (not (boolean? #t)) 15 (boolean? #f))"));
      TEST_EQ("-23", run(R"((if (if (char? #\a) (boolean? #\b) (fixnum? #\c)) 119 -23))"));
      TEST_EQ("6", run(R"((if (if (if (not 1) (not 2) (not 3)) 4 5) 6 7))"));
      TEST_EQ("7", run(R"((if (not (if (if (not 1) (not 2) (not 3)) 4 5)) 6 7))"));
      TEST_EQ("#f", run(R"((not (if (not (if (if (not 1) (not 2) (not 3)) 4 5)) 6 7)) )"));
      TEST_EQ("14", run(R"((if (char? 12) 13 14) )"));
      TEST_EQ("13", run(R"((if (char? #\a) 13 14) )"));
      TEST_EQ("13", run(R"((add1 (if (sub1 1) (sub1 13) 14)))"));

      TEST_EQ("13", run("(if (= 12 13) 12 13) "));
      TEST_EQ("13", run("(if (= 12 12) 13 14) "));
      TEST_EQ("12", run("(if (< 12 13) 12 13) "));
      TEST_EQ("14", run("(if (< 12 12) 13 14) "));
      TEST_EQ("14", run("(if (< 13 12) 13 14) "));
      TEST_EQ("12", run("(if (<= 12 13) 12 13) "));
      TEST_EQ("12", run("(if (<= 12 12) 12 13) "));
      TEST_EQ("14", run("(if (<= 13 12) 13 14) "));
      TEST_EQ("13", run("(if (> 12 13) 12 13) "));
      TEST_EQ("13", run("(if (> 12 12) 12 13) "));
      TEST_EQ("13", run("(if (> 13 12) 13 14) "));
      TEST_EQ("13", run("(if (>= 12 13) 12 13) "));
      TEST_EQ("12", run("(if (>= 12 12) 12 13) "));
      TEST_EQ("13", run("(if (>= 13 12) 13 14) "));
      }